

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Array<kj::_::KeyMaybeVal> *
kj::_::toKeysAndVals
          (Array<kj::_::KeyMaybeVal> *__return_storage_ptr__,
          ArrayPtr<kj::ArrayPtr<const_char>_> *params)

{
  unsigned_long uVar1;
  ArrayDisposer *this;
  size_t sVar2;
  ArrayPtr<const_char> *pAVar3;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar4;
  ArrayPtr<const_char> *pAVar5;
  KeyMaybeVal *pKVar6;
  Maybe<kj::ArrayPtr<const_char>_> *other_00;
  Array<kj::_::KeyMaybeVal> *other_01;
  ArrayPtr<const_char> AVar7;
  ArrayPtr<const_char> *v;
  ArrayPtr<const_char> *_v4870;
  size_t local_d8;
  ArrayPtr<const_char> local_d0;
  unsigned_long *local_c0;
  unsigned_long *index;
  ArrayPtr<const_char> local_b0;
  undefined1 local_a0 [8];
  NullableValue<unsigned_long> _index4865;
  Maybe<kj::ArrayPtr<const_char>_> value;
  ArrayPtr<const_char> key;
  ArrayPtr<const_char> *param;
  ArrayPtr<const_char> *__end2;
  ArrayPtr<const_char> *local_48;
  ArrayPtr<const_char> *__begin2;
  ArrayPtr<kj::ArrayPtr<const_char>_> *__range2;
  size_t count;
  Array<kj::_::KeyMaybeVal> result;
  ArrayPtr<kj::ArrayPtr<const_char>_> *params_local;
  
  result.disposer = (ArrayDisposer *)params;
  sVar2 = ArrayPtr<kj::ArrayPtr<const_char>_>::size(params);
  heapArray<kj::_::KeyMaybeVal>((Array<kj::_::KeyMaybeVal> *)&count,sVar2);
  this = result.disposer;
  __range2 = (ArrayPtr<kj::ArrayPtr<const_char>_> *)0x0;
  local_48 = ArrayPtr<kj::ArrayPtr<const_char>_>::begin
                       ((ArrayPtr<kj::ArrayPtr<const_char>_> *)result.disposer);
  pAVar3 = ArrayPtr<kj::ArrayPtr<const_char>_>::end((ArrayPtr<kj::ArrayPtr<const_char>_> *)this);
  for (; local_48 != pAVar3; local_48 = local_48 + 1) {
    ArrayPtr<const_char>::ArrayPtr((ArrayPtr<const_char> *)((long)&value.ptr.field_1 + 8));
    Maybe<kj::ArrayPtr<const_char>_>::Maybe((Maybe<kj::ArrayPtr<const_char>_> *)&_index4865.field_1)
    ;
    index._7_1_ = 0x3d;
    ArrayPtr<const_char>::findFirst(&local_b0,(char *)local_48);
    other = readMaybe<unsigned_long>((Maybe<unsigned_long> *)&local_b0);
    NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_a0,other);
    Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_b0);
    puVar4 = NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_a0);
    if (puVar4 == (unsigned_long *)0x0) {
      pAVar5 = mv<kj::ArrayPtr<char_const>const>(local_48);
      value.ptr.field_1.value.size_ = (size_t)pAVar5->ptr;
    }
    else {
      local_c0 = NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_a0);
      AVar7 = ArrayPtr<const_char>::first(local_48,*local_c0);
      value.ptr.field_1.value.size_ = (size_t)AVar7.ptr;
      local_d0 = AVar7;
      stripLeadingAndTrailingSpace((ArrayPtr<const_char> *)((long)&value.ptr.field_1 + 8));
      uVar1 = *local_c0;
      sVar2 = ArrayPtr<const_char>::size(local_48);
      AVar7 = ArrayPtr<const_char>::slice(local_48,uVar1 + 1,sVar2);
      local_d8 = AVar7.size_;
      _v4870 = (ArrayPtr<const_char> *)AVar7.ptr;
      Maybe<kj::ArrayPtr<const_char>_>::operator=
                ((Maybe<kj::ArrayPtr<const_char>_> *)&_index4865.field_1,
                 (ArrayPtr<const_char> *)&_v4870);
      pAVar5 = readMaybe<kj::ArrayPtr<char_const>>
                         ((Maybe<kj::ArrayPtr<const_char>_> *)&_index4865.field_1);
      if (pAVar5 != (ArrayPtr<const_char> *)0x0) {
        stripLeadingAndTrailingSpace(pAVar5);
      }
    }
    NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_a0);
    pAVar5 = mv<kj::ArrayPtr<char_const>>((ArrayPtr<const_char> *)((long)&value.ptr.field_1 + 8));
    pKVar6 = Array<kj::_::KeyMaybeVal>::operator[]
                       ((Array<kj::_::KeyMaybeVal> *)&count,(size_t)__range2);
    sVar2 = pAVar5->size_;
    (pKVar6->key).ptr = pAVar5->ptr;
    (pKVar6->key).size_ = sVar2;
    other_00 = mv<kj::Maybe<kj::ArrayPtr<char_const>>>
                         ((Maybe<kj::ArrayPtr<const_char>_> *)&_index4865.field_1);
    pKVar6 = Array<kj::_::KeyMaybeVal>::operator[]
                       ((Array<kj::_::KeyMaybeVal> *)&count,(size_t)__range2);
    Maybe<kj::ArrayPtr<const_char>_>::operator=(&pKVar6->val,other_00);
    __range2 = (ArrayPtr<kj::ArrayPtr<const_char>_> *)((long)&__range2->ptr + 1);
    Maybe<kj::ArrayPtr<const_char>_>::~Maybe
              ((Maybe<kj::ArrayPtr<const_char>_> *)&_index4865.field_1);
  }
  other_01 = mv<kj::Array<kj::_::KeyMaybeVal>>((Array<kj::_::KeyMaybeVal> *)&count);
  Array<kj::_::KeyMaybeVal>::Array(__return_storage_ptr__,other_01);
  Array<kj::_::KeyMaybeVal>::~Array((Array<kj::_::KeyMaybeVal> *)&count);
  return __return_storage_ptr__;
}

Assistant:

kj::Array<KeyMaybeVal> toKeysAndVals(const kj::ArrayPtr<kj::ArrayPtr<const char>>& params) {
  // Given a collection of parameters (a single offer), parse the parameters into <key, MaybeValue>
  // pairs. If the parameter contains an `=`, we set the `key` to everything before, and the `value`
  // to everything after. Otherwise, we set the `key` to be the entire parameter.
  // Either way, both the key and value (if it exists) are stripped of leading & trailing whitespace.
  auto result = kj::heapArray<KeyMaybeVal>(params.size());
  size_t count = 0;
  for (const auto& param : params) {
    kj::ArrayPtr<const char> key;
    kj::Maybe<kj::ArrayPtr<const char>> value;

    KJ_IF_SOME(index, param.findFirst('=')) {
      // Found '=' so we have a value.
      key = param.first(index);
      stripLeadingAndTrailingSpace(key);
      value = param.slice(index + 1, param.size());
      KJ_IF_SOME(v, value) {
        stripLeadingAndTrailingSpace(v);
      }
    } else {
      key = kj::mv(param);
    }

    result[count].key = kj::mv(key);
    result[count].val = kj::mv(value);
    ++count;
  }